

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DSAParameters.cpp
# Opt level: O2

ByteString * __thiscall
DSAParameters::serialise(ByteString *__return_storage_ptr__,DSAParameters *this)

{
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_60,&this->p);
  ByteString::serialise(&local_88,&this->q);
  operator+(&local_38,&local_60,&local_88);
  ByteString::serialise(&local_b0,&this->g);
  operator+(__return_storage_ptr__,&local_38,&local_b0);
  ByteString::~ByteString(&local_b0);
  ByteString::~ByteString(&local_38);
  ByteString::~ByteString(&local_88);
  ByteString::~ByteString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteString DSAParameters::serialise() const
{
	return p.serialise() + q.serialise() + g.serialise();
}